

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeNames(WasmBinaryWriter *this)

{
  pointer puVar1;
  pointer pHVar2;
  BufferWithRandomAccess *pBVar3;
  pointer puVar4;
  Table *pTVar5;
  pointer puVar6;
  Memory *pMVar7;
  pointer puVar8;
  Global *pGVar9;
  pointer puVar10;
  ElementSegment *pEVar11;
  pointer puVar12;
  char *pcVar13;
  pointer ppVar14;
  pointer ppVar15;
  bool bVar16;
  int32_t start;
  int32_t iVar17;
  size_t sVar18;
  size_t sVar19;
  iterator iVar20;
  mapped_type *pmVar21;
  size_type sVar22;
  mapped_type *pmVar23;
  mapped_type *pmVar24;
  Module *pMVar25;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *seg;
  pointer puVar26;
  pointer puVar27;
  Function *pFVar28;
  Index IVar29;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar30;
  pointer pHVar31;
  pointer puVar32;
  pointer puVar33;
  pointer puVar34;
  pointer puVar35;
  Index index;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import_2;
  ulong uVar36;
  __node_base *p_Var37;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import_3;
  undefined1 auVar38 [8];
  uint uVar39;
  U32LEB UVar40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import_1;
  undefined1 auVar41 [8];
  string_view name;
  undefined1 local_8c [8];
  Index checked_1;
  undefined1 local_80 [8];
  Index checked;
  undefined1 auStack_68 [8];
  vector<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  localsWithNames;
  undefined1 auStack_48 [8];
  vector<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  functionsWithNames;
  
  start = startSection<wasm::BinaryConsts::Section>(this,Custom);
  pcVar13 = BinaryConsts::CustomSections::Name;
  sVar18 = strlen(BinaryConsts::CustomSections::Name);
  name._M_str = pcVar13;
  name._M_len = sVar18;
  writeInlineString(this,name);
  if ((this->emitModuleName == true) && ((this->wasm->name).super_IString.str._M_str != (char *)0x0)
     ) {
    iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameModule);
    writeEscapedName(this,(this->wasm->name).super_IString.str);
    finishSection(this,iVar17);
  }
  if (this->debugInfo == false) {
    finishSection(this,start);
    return;
  }
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  localsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80;
  local_80._0_4_ = 0;
  auStack_48 = (undefined1  [8])0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])auStack_48;
  for (puVar30 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar1; puVar30 = puVar30 + 1
      ) {
    pFVar28 = (puVar30->_M_t).
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(pFVar28->super_Importable).module + 8) != (char *)0x0) {
      writeNames::anon_class_16_2_9999778b::operator()
                ((anon_class_16_2_9999778b *)auStack_68,pFVar28);
    }
  }
  localsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80;
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])auStack_48;
  for (puVar30 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar1; puVar30 = puVar30 + 1
      ) {
    pFVar28 = (puVar30->_M_t).
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(pFVar28->super_Importable).module + 8) == (char *)0x0) {
      writeNames::anon_class_16_2_9999778b::operator()
                ((anon_class_16_2_9999778b *)auStack_68,pFVar28);
    }
  }
  if ((this->indexes).functionIndexes._M_h._M_element_count != (ulong)(uint)local_80._0_4_) {
    __assert_fail("checked == indexes.functionIndexes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x385,"void wasm::WasmBinaryWriter::writeNames()");
  }
  if ((undefined1  [8])
      functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_48) {
    iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,DylinkMemInfo);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)(uint)((ulong)((long)functionsWithNames.
                                                                                                        
                                                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                             (long)auStack_48) >> 4));
    ppVar15 = functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (auVar38 = auStack_48; auVar38 != (undefined1  [8])ppVar15;
        auVar38 = (undefined1  [8])((long)auVar38 + 0x10)) {
      BufferWithRandomAccess::operator<<(this->o,(U32LEB)((pointer)auVar38)->first);
      writeEscapedName(this,(((pointer)auVar38)->second->super_Importable).super_Named.name.
                            super_IString.str);
    }
    finishSection(this,iVar17);
  }
  std::
  _Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   *)auStack_48);
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  localsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_8c;
  local_8c._0_4_ = 0;
  auStack_48 = (undefined1  [8])0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])auStack_48;
  for (puVar30 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar1; puVar30 = puVar30 + 1
      ) {
    pFVar28 = (puVar30->_M_t).
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(pFVar28->super_Importable).module + 8) != (char *)0x0) {
      writeNames::anon_class_16_2_f4096cd2::operator()
                ((anon_class_16_2_f4096cd2 *)auStack_68,pFVar28);
    }
  }
  localsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_8c;
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])auStack_48;
  for (puVar30 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar1; puVar30 = puVar30 + 1
      ) {
    pFVar28 = (puVar30->_M_t).
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(pFVar28->super_Importable).module + 8) == (char *)0x0) {
      writeNames::anon_class_16_2_f4096cd2::operator()
                ((anon_class_16_2_f4096cd2 *)auStack_68,pFVar28);
    }
  }
  if ((this->indexes).functionIndexes._M_h._M_element_count != (ulong)(uint)local_8c._0_4_) {
    __assert_fail("checked == indexes.functionIndexes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x3a4,"void wasm::WasmBinaryWriter::writeNames()");
  }
  if ((undefined1  [8])
      functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_48) {
    iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,DylinkNeeded);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)(uint)((ulong)((long)functionsWithNames.
                                                                                                        
                                                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                             (long)auStack_48) >> 4));
    ppVar15 = functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    unique0x00004880 = &(this->funcMappedLocals)._M_h;
    uVar39 = 0;
    for (auVar38 = auStack_48; auVar38 != (undefined1  [8])ppVar15;
        auVar38 = (undefined1  [8])((long)auVar38 + 0x10)) {
      auStack_68 = (undefined1  [8])0x0;
      localsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      localsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sVar19 = Function::getNumLocals(((pointer)auVar38)->second);
      uVar36 = 0;
      while (index = (Index)uVar36, uVar36 < sVar19) {
        bVar16 = Function::hasLocalName(((pointer)auVar38)->second,index);
        if (bVar16) {
          iVar20 = std::
                   _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(stack0xffffffffffffff78,(key_type *)((pointer)auVar38)->second);
          if (iVar20.
              super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            pFVar28 = ((pointer)auVar38)->second;
            IVar29 = index;
            if ((pFVar28->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
              __assert_fail("func->imported()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                            ,0x3bb,"void wasm::WasmBinaryWriter::writeNames()");
            }
          }
          else {
            local_80._4_4_ = 0;
            local_80._0_4_ = index;
            pmVar21 = std::__detail::
                      _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)((long)iVar20.
                                             super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_true>
                                             ._M_cur + 0x18),(key_type *)local_80);
            pFVar28 = ((pointer)auVar38)->second;
            IVar29 = (Index)*pmVar21;
          }
          _checked = (string_view)Function::getLocalName(pFVar28,index);
          local_80._0_4_ = IVar29;
          std::
          vector<std::pair<unsigned_int,wasm::Name>,std::allocator<std::pair<unsigned_int,wasm::Name>>>
          ::emplace_back<std::pair<unsigned_int,wasm::Name>>
                    ((vector<std::pair<unsigned_int,wasm::Name>,std::allocator<std::pair<unsigned_int,wasm::Name>>>
                      *)auStack_68,(pair<unsigned_int,_wasm::Name> *)local_80);
        }
        uVar36 = (ulong)(index + 1);
      }
      if ((undefined1  [8])
          localsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
          ._M_impl.super__Vector_impl_data._M_start == auStack_68) {
        __assert_fail("localsWithNames.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                      ,0x3c2,"void wasm::WasmBinaryWriter::writeNames()");
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,wasm::Name>*,std::vector<std::pair<unsigned_int,wasm::Name>,std::allocator<std::pair<unsigned_int,wasm::Name>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
      BufferWithRandomAccess::operator<<(this->o,(U32LEB)((pointer)auVar38)->first);
      BufferWithRandomAccess::operator<<
                (this->o,(U32LEB)(uint)(((long)localsWithNames.
                                               super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start -
                                        (long)auStack_68) / 0x18));
      ppVar14 = localsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (auVar41 = auStack_68; auVar41 != (undefined1  [8])ppVar14;
          auVar41 = (undefined1  [8])((long)auVar41 + 0x18)) {
        BufferWithRandomAccess::operator<<
                  (this->o,(U32LEB)*(uint *)&(((_Vector_impl *)&((pointer)auVar41)->first)->
                                             super__Vector_impl_data)._M_start);
        writeEscapedName(this,(((pointer)auVar41)->second).super_IString.str);
      }
      uVar39 = uVar39 + 1;
      std::
      _Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
      ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
                       *)auStack_68);
    }
    if ((long)functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >> 4 != (ulong)uVar39) {
      __assert_fail("emitted == functionsWithLocalNames.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x3cc,"void wasm::WasmBinaryWriter::writeNames()");
    }
    finishSection(this,iVar17);
  }
  std::
  _Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                   *)auStack_48);
  auStack_48 = (undefined1  [8])0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pHVar2 = (this->indexedTypes).types.
           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pHVar31 = (this->indexedTypes).types.
                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                 super__Vector_impl_data._M_start; pHVar31 != pHVar2; pHVar31 = pHVar31 + 1) {
    auStack_68 = (undefined1  [8])pHVar31->id;
    sVar22 = std::
             _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::count(&(this->wasm->typeNames)._M_h,(key_type *)auStack_68);
    if (sVar22 != 0) {
      pmVar23 = std::__detail::
                _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->wasm->typeNames,(key_type *)auStack_68);
      if ((pmVar23->name).super_IString.str._M_str != (char *)0x0) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
                   (key_type *)auStack_68);
      }
    }
  }
  if (auStack_48 !=
      (undefined1  [8])
      functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameType);
    stack0xffffffffffffff78 =
         (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)CONCAT44(checked_1,iVar17);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)(uint)((ulong)((long)functionsWithNames.
                                                                                                        
                                                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                             (long)auStack_48) >> 3));
    ppVar15 = functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (auVar38 = auStack_48; auVar38 != (undefined1  [8])ppVar15;
        auVar38 = (undefined1  [8])&((pointer)auVar38)->second) {
      auStack_68 = *(undefined1 (*) [8])auVar38;
      pBVar3 = this->o;
      pmVar24 = std::__detail::
                _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&(this->indexedTypes).indices,(key_type *)auStack_68);
      BufferWithRandomAccess::operator<<(pBVar3,(U32LEB)*pmVar24);
      pmVar23 = std::__detail::
                _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->wasm->typeNames,(key_type *)auStack_68);
      writeEscapedName(this,(pmVar23->name).super_IString.str);
    }
    finishSection(this,local_8c._4_4_);
  }
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48);
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._0_4_ = 0;
  auStack_48 = (undefined1  [8])0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  localsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80;
  puVar4 = (this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])auStack_48;
  for (puVar32 = (this->wasm->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar32 != puVar4; puVar32 = puVar32 + 1
      ) {
    pTVar5 = (puVar32->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
             super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    if (*(char **)((long)&(pTVar5->super_Importable).module + 8) != (char *)0x0) {
      writeNames::anon_class_16_2_aa9076f3::operator()
                ((anon_class_16_2_aa9076f3 *)auStack_68,pTVar5);
    }
  }
  localsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80;
  puVar4 = (this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])auStack_48;
  for (puVar32 = (this->wasm->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar32 != puVar4; puVar32 = puVar32 + 1
      ) {
    pTVar5 = (puVar32->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
             super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    if (*(char **)((long)&(pTVar5->super_Importable).module + 8) == (char *)0x0) {
      writeNames::anon_class_16_2_aa9076f3::operator()
                ((anon_class_16_2_aa9076f3 *)auStack_68,pTVar5);
    }
  }
  if ((this->indexes).tableIndexes._M_h._M_element_count != (ulong)(uint)local_80._0_4_) {
    __assert_fail("checked == indexes.tableIndexes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x3f1,"void wasm::WasmBinaryWriter::writeNames()");
  }
  if ((undefined1  [8])
      functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_48) {
    iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameTable);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)(uint)((ulong)((long)functionsWithNames.
                                                                                                        
                                                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                             (long)auStack_48) >> 4));
    ppVar15 = functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (auVar38 = auStack_48; auVar38 != (undefined1  [8])ppVar15;
        auVar38 = (undefined1  [8])((long)auVar38 + 0x10)) {
      BufferWithRandomAccess::operator<<(this->o,(U32LEB)((pointer)auVar38)->first);
      writeEscapedName(this,(((pointer)auVar38)->second->super_Importable).super_Named.name.
                            super_IString.str);
    }
    finishSection(this,iVar17);
  }
  std::
  _Vector_base<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_wasm::Table_*>,_std::allocator<std::pair<unsigned_int,_wasm::Table_*>_>_>
                   *)auStack_48);
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._0_4_ = 0;
  auStack_48 = (undefined1  [8])0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  localsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80;
  puVar6 = (this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])auStack_48;
  for (puVar33 = (this->wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar33 != puVar6; puVar33 = puVar33 + 1
      ) {
    pMVar7 = (puVar33->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if (*(char **)((long)&(pMVar7->super_Importable).module + 8) != (char *)0x0) {
      writeNames::anon_class_16_2_5b4c7dad::operator()
                ((anon_class_16_2_5b4c7dad *)auStack_68,pMVar7);
    }
  }
  localsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80;
  puVar6 = (this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])auStack_48;
  for (puVar33 = (this->wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar33 != puVar6; puVar33 = puVar33 + 1
      ) {
    pMVar7 = (puVar33->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if (*(char **)((long)&(pMVar7->super_Importable).module + 8) == (char *)0x0) {
      writeNames::anon_class_16_2_5b4c7dad::operator()
                ((anon_class_16_2_5b4c7dad *)auStack_68,pMVar7);
    }
  }
  if ((this->indexes).memoryIndexes._M_h._M_element_count != (ulong)(uint)local_80._0_4_) {
    __assert_fail("checked == indexes.memoryIndexes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x40d,"void wasm::WasmBinaryWriter::writeNames()");
  }
  if ((undefined1  [8])
      functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_48) {
    iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameMemory);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)(uint)((ulong)((long)functionsWithNames.
                                                                                                        
                                                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                             (long)auStack_48) >> 4));
    ppVar15 = functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (auVar38 = auStack_48; auVar38 != (undefined1  [8])ppVar15;
        auVar38 = (undefined1  [8])((long)auVar38 + 0x10)) {
      BufferWithRandomAccess::operator<<(this->o,(U32LEB)((pointer)auVar38)->first);
      writeEscapedName(this,(((pointer)auVar38)->second->super_Importable).super_Named.name.
                            super_IString.str);
    }
    finishSection(this,iVar17);
  }
  std::
  _Vector_base<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_wasm::Memory_*>,_std::allocator<std::pair<unsigned_int,_wasm::Memory_*>_>_>
                   *)auStack_48);
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._0_4_ = 0;
  auStack_48 = (undefined1  [8])0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  localsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80;
  puVar8 = (this->wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])auStack_48;
  for (puVar34 = (this->wasm->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar34 != puVar8; puVar34 = puVar34 + 1
      ) {
    pGVar9 = (puVar34->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar9->super_Importable).module + 8) != (char *)0x0) {
      writeNames::anon_class_16_2_53660720::operator()
                ((anon_class_16_2_53660720 *)auStack_68,pGVar9);
    }
  }
  localsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80;
  puVar8 = (this->wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])auStack_48;
  for (puVar34 = (this->wasm->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar34 != puVar8; puVar34 = puVar34 + 1
      ) {
    pGVar9 = (puVar34->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar9->super_Importable).module + 8) == (char *)0x0) {
      writeNames::anon_class_16_2_53660720::operator()
                ((anon_class_16_2_53660720 *)auStack_68,pGVar9);
    }
  }
  if ((this->indexes).globalIndexes._M_h._M_element_count != (ulong)(uint)local_80._0_4_) {
    __assert_fail("checked == indexes.globalIndexes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x426,"void wasm::WasmBinaryWriter::writeNames()");
  }
  if ((undefined1  [8])
      functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_48) {
    iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameGlobal);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)(uint)((ulong)((long)functionsWithNames.
                                                                                                        
                                                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                             (long)auStack_48) >> 4));
    ppVar15 = functionsWithNames.
              super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (auVar38 = auStack_48; auVar38 != (undefined1  [8])ppVar15;
        auVar38 = (undefined1  [8])((long)auVar38 + 0x10)) {
      BufferWithRandomAccess::operator<<(this->o,(U32LEB)((pointer)auVar38)->first);
      writeEscapedName(this,(((pointer)auVar38)->second->super_Importable).super_Named.name.
                            super_IString.str);
    }
    finishSection(this,iVar17);
  }
  std::
  _Vector_base<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_wasm::Global_*>,_std::allocator<std::pair<unsigned_int,_wasm::Global_*>_>_>
                   *)auStack_48);
  auStack_48 = (undefined1  [8])0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functionsWithNames.
  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar10 = (this->wasm->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar39 = 0;
  for (puVar35 = (this->wasm->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar35 != puVar10;
      puVar35 = puVar35 + 1) {
    pEVar11 = (puVar35->_M_t).
              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    if ((pEVar11->super_Named).hasExplicitName == true) {
      auStack_68._0_4_ = uVar39;
      localsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Name>,_std::allocator<std::pair<unsigned_int,_wasm::Name>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pEVar11;
      std::
      vector<std::pair<unsigned_int,wasm::ElementSegment*>,std::allocator<std::pair<unsigned_int,wasm::ElementSegment*>>>
      ::emplace_back<std::pair<unsigned_int,wasm::ElementSegment*>>
                ((vector<std::pair<unsigned_int,wasm::ElementSegment*>,std::allocator<std::pair<unsigned_int,wasm::ElementSegment*>>>
                  *)auStack_48,(pair<unsigned_int,_wasm::ElementSegment_*> *)auStack_68);
    }
    uVar39 = uVar39 + 1;
  }
  if ((this->indexes).elemIndexes._M_h._M_element_count == (ulong)uVar39) {
    if ((undefined1  [8])
        functionsWithNames.
        super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != auStack_48) {
      iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameElem);
      BufferWithRandomAccess::operator<<
                (this->o,(U32LEB)(uint)((ulong)((long)functionsWithNames.
                                                                                                            
                                                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                               (long)auStack_48) >> 4));
      ppVar15 = functionsWithNames.
                super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (auVar38 = auStack_48; auVar38 != (undefined1  [8])ppVar15;
          auVar38 = (undefined1  [8])((long)auVar38 + 0x10)) {
        BufferWithRandomAccess::operator<<(this->o,(U32LEB)((pointer)auVar38)->first);
        writeEscapedName(this,(((pointer)auVar38)->second->super_Importable).super_Named.name.
                              super_IString.str);
      }
      finishSection(this,iVar17);
    }
    std::
    _Vector_base<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
    ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_wasm::ElementSegment_*>,_std::allocator<std::pair<unsigned_int,_wasm::ElementSegment_*>_>_>
                     *)auStack_48);
    pMVar25 = this->wasm;
    UVar40.value = 0;
    for (puVar26 = (pMVar25->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        puVar26 !=
        (pMVar25->dataSegments).
        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; puVar26 = puVar26 + 1) {
      UVar40.value = UVar40.value +
                     (((puVar26->_M_t).
                       super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                       .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->super_Named
                     ).hasExplicitName;
    }
    if (UVar40.value != 0) {
      iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameData);
      BufferWithRandomAccess::operator<<(this->o,UVar40);
      UVar40.value = 0;
      while( true ) {
        uVar36 = (ulong)UVar40.value;
        puVar26 = (this->wasm->dataSegments).
                  super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->wasm->dataSegments).
                          super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar26 >> 3) <= uVar36
           ) break;
        if (*(char *)((long)puVar26[uVar36]._M_t.
                            super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                            ._M_t + 0x10) == '\x01') {
          BufferWithRandomAccess::operator<<(this->o,UVar40);
          writeEscapedName(this,*(string_view *)
                                 puVar26[uVar36]._M_t.
                                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                 ._M_t);
        }
        UVar40.value = UVar40.value + 1;
      }
      finishSection(this,iVar17);
      pMVar25 = this->wasm;
    }
    if (((pMVar25->features).features & 0x400) != 0) {
      functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_48 = (undefined1  [8])0x0;
      functionsWithNames.
      super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pHVar2 = (this->indexedTypes).types.
               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pHVar31 = (this->indexedTypes).types.
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                     super__Vector_impl_data._M_start; pHVar31 != pHVar2; pHVar31 = pHVar31 + 1) {
        bVar16 = HeapType::isStruct(pHVar31);
        if (bVar16) {
          sVar22 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::count(&(this->wasm->typeNames)._M_h,pHVar31);
          if (sVar22 != 0) {
            pmVar23 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->wasm->typeNames,pHVar31);
            if ((pmVar23->fieldNames)._M_h._M_element_count != 0) {
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
                         pHVar31);
            }
          }
        }
      }
      if (auStack_48 !=
          (undefined1  [8])
          functionsWithNames.
          super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameField);
        stack0xffffffffffffff78 =
             (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)CONCAT44(checked_1,iVar17);
        BufferWithRandomAccess::operator<<
                  (this->o,(U32LEB)(uint)((ulong)((long)functionsWithNames.
                                                                                                                
                                                  super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                                 (long)auStack_48) >> 3));
        uVar39 = 0;
        while( true ) {
          if ((ulong)((long)functionsWithNames.
                            super__Vector_base<std::pair<unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<unsigned_int,_wasm::Function_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >> 3) <=
              (ulong)uVar39) break;
          auStack_68 = *(undefined1 (*) [8])((uint *)auStack_48 + (ulong)uVar39 * 2);
          pBVar3 = this->o;
          pmVar24 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&(this->indexedTypes).indices,(key_type *)auStack_68);
          BufferWithRandomAccess::operator<<(pBVar3,(U32LEB)*pmVar24);
          pmVar23 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::at((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->wasm->typeNames,(key_type *)auStack_68);
          BufferWithRandomAccess::operator<<
                    (this->o,(U32LEB)(uint)(pmVar23->fieldNames)._M_h._M_element_count);
          p_Var37 = &(pmVar23->fieldNames)._M_h._M_before_begin;
          while (p_Var37 = p_Var37->_M_nxt, p_Var37 != (__node_base *)0x0) {
            BufferWithRandomAccess::operator<<(this->o,(U32LEB)(uint)*(size_type *)(p_Var37 + 1));
            writeEscapedName(this,*(string_view *)(p_Var37 + 2));
          }
          uVar39 = uVar39 + 1;
        }
        finishSection(this,local_8c._4_4_);
      }
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48);
      pMVar25 = this->wasm;
    }
    puVar27 = (pMVar25->tags).
              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar12 = (pMVar25->tags).
              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar27 != puVar12) {
      UVar40.value = 0;
      for (; puVar27 != puVar12; puVar27 = puVar27 + 1) {
        UVar40.value = UVar40.value +
                       *(bool *)((long)&(((puVar27->_M_t).
                                          super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                          .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl)->
                                        super_Importable).super_Named + 0x10);
      }
      if (UVar40.value != 0) {
        iVar17 = startSection<wasm::BinaryConsts::CustomSections::Subsection>(this,NameTag);
        BufferWithRandomAccess::operator<<(this->o,UVar40);
        UVar40.value = 0;
        while( true ) {
          uVar36 = (ulong)UVar40.value;
          puVar27 = (this->wasm->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->wasm->tags).
                            super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar27 >> 3) <=
              uVar36) break;
          if (*(char *)((long)puVar27[uVar36]._M_t.
                              super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t
                       + 0x10) == '\x01') {
            BufferWithRandomAccess::operator<<(this->o,UVar40);
            writeEscapedName(this,*(string_view *)
                                   puVar27[uVar36]._M_t.
                                   super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                                   ._M_t);
          }
          UVar40.value = UVar40.value + 1;
        }
        finishSection(this,iVar17);
      }
    }
    finishSection(this,start);
    return;
  }
  __assert_fail("checked == indexes.elemIndexes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                ,0x43d,"void wasm::WasmBinaryWriter::writeNames()");
}

Assistant:

void WasmBinaryWriter::writeNames() {
  auto start = startSection(BinaryConsts::Section::Custom);
  writeInlineString(BinaryConsts::CustomSections::Name);

  // module name
  if (emitModuleName && wasm->name.is()) {
    auto substart =
      startSubsection(BinaryConsts::CustomSections::Subsection::NameModule);
    writeEscapedName(wasm->name.str);
    finishSubsection(substart);
  }

  if (!debugInfo) {
    // We were only writing the module name.
    finishSection(start);
    return;
  }

  // function names
  {
    std::vector<std::pair<Index, Function*>> functionsWithNames;
    Index checked = 0;
    auto check = [&](Function* curr) {
      if (curr->hasExplicitName) {
        functionsWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedFunctions(*wasm, check);
    ModuleUtils::iterDefinedFunctions(*wasm, check);
    assert(checked == indexes.functionIndexes.size());
    if (functionsWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameFunction);
      o << U32LEB(functionsWithNames.size());
      for (auto& [index, global] : functionsWithNames) {
        o << U32LEB(index);
        writeEscapedName(global->name.str);
      }
      finishSubsection(substart);
    }
  }

  // local names
  {
    // Find all functions with at least one local name and only emit the
    // subsection if there is at least one.
    std::vector<std::pair<Index, Function*>> functionsWithLocalNames;
    Index checked = 0;
    auto check = [&](Function* curr) {
      auto numLocals = curr->getNumLocals();
      for (Index i = 0; i < numLocals; ++i) {
        if (curr->hasLocalName(i)) {
          functionsWithLocalNames.push_back({checked, curr});
          break;
        }
      }
      checked++;
    };
    ModuleUtils::iterImportedFunctions(*wasm, check);
    ModuleUtils::iterDefinedFunctions(*wasm, check);
    assert(checked == indexes.functionIndexes.size());
    if (functionsWithLocalNames.size() > 0) {
      // Otherwise emit those functions but only include locals with a name.
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameLocal);
      o << U32LEB(functionsWithLocalNames.size());
      Index emitted = 0;
      for (auto& [index, func] : functionsWithLocalNames) {
        // Pairs of (local index in IR, name).
        std::vector<std::pair<Index, Name>> localsWithNames;
        auto numLocals = func->getNumLocals();
        for (Index indexInFunc = 0; indexInFunc < numLocals; ++indexInFunc) {
          if (func->hasLocalName(indexInFunc)) {
            Index indexInBinary;
            auto iter = funcMappedLocals.find(func->name);
            if (iter != funcMappedLocals.end()) {
              // TODO: handle multivalue
              indexInBinary = iter->second[{indexInFunc, 0}];
            } else {
              // No data on funcMappedLocals. That is only possible if we are an
              // imported function, where there are no locals to map, and in
              // that case the index is unchanged anyhow: parameters always have
              // the same index, they are not mapped in any way.
              assert(func->imported());
              indexInBinary = indexInFunc;
            }
            localsWithNames.push_back(
              {indexInBinary, func->getLocalName(indexInFunc)});
          }
        }
        assert(localsWithNames.size());
        std::sort(localsWithNames.begin(), localsWithNames.end());
        o << U32LEB(index);
        o << U32LEB(localsWithNames.size());
        for (auto& [indexInBinary, name] : localsWithNames) {
          o << U32LEB(indexInBinary);
          writeEscapedName(name.str);
        }
        emitted++;
      }
      assert(emitted == functionsWithLocalNames.size());
      finishSubsection(substart);
    }
  }

  // type names
  {
    std::vector<HeapType> namedTypes;
    for (auto type : indexedTypes.types) {
      if (wasm->typeNames.count(type) && wasm->typeNames[type].name.is()) {
        namedTypes.push_back(type);
      }
    }
    if (!namedTypes.empty()) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameType);
      o << U32LEB(namedTypes.size());
      for (auto type : namedTypes) {
        o << U32LEB(indexedTypes.indices[type]);
        writeEscapedName(wasm->typeNames[type].name.str);
      }
      finishSubsection(substart);
    }
  }

  // table names
  {
    std::vector<std::pair<Index, Table*>> tablesWithNames;
    Index checked = 0;
    auto check = [&](Table* curr) {
      if (curr->hasExplicitName) {
        tablesWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedTables(*wasm, check);
    ModuleUtils::iterDefinedTables(*wasm, check);
    assert(checked == indexes.tableIndexes.size());

    if (tablesWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameTable);
      o << U32LEB(tablesWithNames.size());

      for (auto& [index, table] : tablesWithNames) {
        o << U32LEB(index);
        writeEscapedName(table->name.str);
      }

      finishSubsection(substart);
    }
  }

  // memory names
  {
    std::vector<std::pair<Index, Memory*>> memoriesWithNames;
    Index checked = 0;
    auto check = [&](Memory* curr) {
      if (curr->hasExplicitName) {
        memoriesWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedMemories(*wasm, check);
    ModuleUtils::iterDefinedMemories(*wasm, check);
    assert(checked == indexes.memoryIndexes.size());
    if (memoriesWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameMemory);
      o << U32LEB(memoriesWithNames.size());
      for (auto& [index, memory] : memoriesWithNames) {
        o << U32LEB(index);
        writeEscapedName(memory->name.str);
      }
      finishSubsection(substart);
    }
  }

  // global names
  {
    std::vector<std::pair<Index, Global*>> globalsWithNames;
    Index checked = 0;
    auto check = [&](Global* curr) {
      if (curr->hasExplicitName) {
        globalsWithNames.push_back({checked, curr});
      }
      checked++;
    };
    ModuleUtils::iterImportedGlobals(*wasm, check);
    ModuleUtils::iterDefinedGlobals(*wasm, check);
    assert(checked == indexes.globalIndexes.size());
    if (globalsWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameGlobal);
      o << U32LEB(globalsWithNames.size());
      for (auto& [index, global] : globalsWithNames) {
        o << U32LEB(index);
        writeEscapedName(global->name.str);
      }
      finishSubsection(substart);
    }
  }

  // elem segment names
  {
    std::vector<std::pair<Index, ElementSegment*>> elemsWithNames;
    Index checked = 0;
    for (auto& curr : wasm->elementSegments) {
      if (curr->hasExplicitName) {
        elemsWithNames.push_back({checked, curr.get()});
      }
      checked++;
    }
    assert(checked == indexes.elemIndexes.size());

    if (elemsWithNames.size() > 0) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameElem);
      o << U32LEB(elemsWithNames.size());

      for (auto& [index, elem] : elemsWithNames) {
        o << U32LEB(index);
        writeEscapedName(elem->name.str);
      }

      finishSubsection(substart);
    }
  }

  // data segment names
  {
    Index count = 0;
    for (auto& seg : wasm->dataSegments) {
      if (seg->hasExplicitName) {
        count++;
      }
    }

    if (count) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameData);
      o << U32LEB(count);
      for (Index i = 0; i < wasm->dataSegments.size(); i++) {
        auto& seg = wasm->dataSegments[i];
        if (seg->hasExplicitName) {
          o << U32LEB(i);
          writeEscapedName(seg->name.str);
        }
      }
      finishSubsection(substart);
    }
  }

  // TODO: label, type, and element names
  // see: https://github.com/WebAssembly/extended-name-section

  // GC field names
  if (wasm->features.hasGC()) {
    std::vector<HeapType> relevantTypes;
    for (auto& type : indexedTypes.types) {
      if (type.isStruct() && wasm->typeNames.count(type) &&
          !wasm->typeNames[type].fieldNames.empty()) {
        relevantTypes.push_back(type);
      }
    }
    if (!relevantTypes.empty()) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameField);
      o << U32LEB(relevantTypes.size());
      for (Index i = 0; i < relevantTypes.size(); i++) {
        auto type = relevantTypes[i];
        o << U32LEB(indexedTypes.indices[type]);
        std::unordered_map<Index, Name>& fieldNames =
          wasm->typeNames.at(type).fieldNames;
        o << U32LEB(fieldNames.size());
        for (auto& [index, name] : fieldNames) {
          o << U32LEB(index);
          writeEscapedName(name.str);
        }
      }
      finishSubsection(substart);
    }
  }

  // tag names
  if (!wasm->tags.empty()) {
    Index count = 0;
    for (auto& tag : wasm->tags) {
      if (tag->hasExplicitName) {
        count++;
      }
    }

    if (count) {
      auto substart =
        startSubsection(BinaryConsts::CustomSections::Subsection::NameTag);
      o << U32LEB(count);
      for (Index i = 0; i < wasm->tags.size(); i++) {
        auto& tag = wasm->tags[i];
        if (tag->hasExplicitName) {
          o << U32LEB(i);
          writeEscapedName(tag->name.str);
        }
      }
      finishSubsection(substart);
    }
  }

  finishSection(start);
}